

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::RunTests(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  bool bVar1;
  int n;
  cmCTestMultiProcessHandler *this_local;
  
  CheckResume(this);
  if ((this->HasCycles & 1U) == 0) {
    this_00 = this->TestHandler;
    n = FindMaxIndex(this);
    cmCTestTestHandler::SetMaxIndex(this_00,n);
    StartNextTests(this);
    while (bVar1 = std::
                   map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   ::empty(&(this->Tests).
                            super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                          ), ((bVar1 ^ 0xffU) & 1) != 0) {
      if ((this->StopTimePassed & 1U) != 0) {
        return;
      }
      CheckOutput(this);
      StartNextTests(this);
    }
    do {
      bVar1 = CheckOutput(this);
    } while (bVar1);
    MarkFinished(this);
    UpdateCostData(this);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RunTests()
{
  this->CheckResume();
  if(this->HasCycles)
    {
    return;
    }
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  this->StartNextTests();
  while(!this->Tests.empty())
    {
    if(this->StopTimePassed)
      {
      return;
      }
    this->CheckOutput();
    this->StartNextTests();
    }
  // let all running tests finish
  while(this->CheckOutput())
    {
    }
  this->MarkFinished();
  this->UpdateCostData();
}